

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.c
# Opt level: O0

char * al_get_first_config_entry
                 (ALLEGRO_CONFIG *config,char *section,ALLEGRO_CONFIG_ENTRY **iterator)

{
  ALLEGRO_CONFIG_SECTION *pAVar1;
  undefined8 *in_RDX;
  long in_RDI;
  ALLEGRO_CONFIG_ENTRY *e;
  ALLEGRO_CONFIG_SECTION *s;
  ALLEGRO_USTR *usection;
  ALLEGRO_USTR_INFO section_info;
  ALLEGRO_USTR *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  byte bVar2;
  char *in_stack_ffffffffffffffb8;
  ALLEGRO_CONFIG_ENTRY *pAVar3;
  ALLEGRO_USTR_INFO *in_stack_ffffffffffffffc0;
  char *local_8;
  
  if (in_RDI == 0) {
    local_8 = (char *)0x0;
  }
  else {
    al_ref_cstr(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    pAVar1 = find_section((ALLEGRO_CONFIG *)
                          CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                          in_stack_ffffffffffffffa8);
    if (pAVar1 == (ALLEGRO_CONFIG_SECTION *)0x0) {
      local_8 = (char *)0x0;
    }
    else {
      pAVar3 = pAVar1->head;
      while( true ) {
        bVar2 = 0;
        if (pAVar3 != (ALLEGRO_CONFIG_ENTRY *)0x0) {
          bVar2 = pAVar3->is_comment;
        }
        if ((bVar2 & 1) == 0) break;
        pAVar3 = pAVar3->next;
      }
      if (in_RDX != (undefined8 *)0x0) {
        *in_RDX = pAVar3;
      }
      if (pAVar3 == (ALLEGRO_CONFIG_ENTRY *)0x0) {
        local_8 = (char *)0x0;
      }
      else {
        local_8 = al_cstr(pAVar3->key);
      }
    }
  }
  return local_8;
}

Assistant:

char const *al_get_first_config_entry(ALLEGRO_CONFIG const *config,
   char const *section, ALLEGRO_CONFIG_ENTRY **iterator)
{
   ALLEGRO_USTR_INFO section_info;
   const ALLEGRO_USTR *usection;
   ALLEGRO_CONFIG_SECTION *s;
   ALLEGRO_CONFIG_ENTRY *e;

   if (!config)
      return NULL;

   if (section == NULL)
      section = "";

   usection = al_ref_cstr(&section_info, section);
   s = find_section(config, usection);
   if (!s)
      return NULL;
   e = s->head;
   while (e && e->is_comment)
      e = e->next;
   if (iterator) *iterator = e;
   return e ? al_cstr(e->key) : NULL;
}